

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

substr __thiscall c4::yml::Tree::arena(Tree *this)

{
  ulong uVar1;
  bool bVar2;
  substr sVar3;
  error_flags eVar4;
  char *s_;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar5;
  char *local_10;
  size_t local_8;
  
  s_ = (char *)(in_RDI + 0x28);
  uVar1 = *(ulong *)(in_RDI + 0x38);
  bVar2 = uVar1 <= *(ulong *)(in_RDI + 0x30);
  uVar5 = bVar2 || uVar1 == 0xffffffffffffffff;
  if (!bVar2 && uVar1 != 0xffffffffffffffff) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) &&
       (in_stack_ffffffffffffffa7 = is_debugger_attached(), (bool)in_stack_ffffffffffffffa7)) {
      trap_instruction();
    }
    handle_error(0x34dd90,(char *)0x154e,"check failed: %s","num <= len || num == npos");
  }
  basic_substring<char>::basic_substring
            ((basic_substring<char> *)CONCAT17(uVar5,in_stack_ffffffffffffffb0),s_,
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  sVar3.len = local_8;
  sVar3.str = local_10;
  return sVar3;
}

Assistant:

substr arena() const { return m_arena.first(m_arena_pos); }